

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::ConcatenationExpression>
          (SequenceMethodExprVisitor *this,ConcatenationExpression *expr)

{
  SourceRange sourceRange;
  bool bVar1;
  Symbol *this_00;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  undefined4 unaff_retaddr;
  DiagCode unaff_retaddr_00;
  bool in_stack_00000017;
  Expression *in_stack_00000018;
  Symbol *sym;
  Diagnostic *this_01;
  SourceLocation visitor;
  
  visitor = in_RDI;
  if ((*(int *)in_RSI != 8) ||
     (this_00 = Expression::getSymbolReference(in_stack_00000018,in_stack_00000017),
     this_00 == (Symbol *)0x0)) goto LAB_0078315c;
  if (this_00->kind != LocalAssertionVar) {
    if (this_00->kind != AssertionPort) goto LAB_0078315c;
    Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x7830ff);
    bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0x783107);
    if (!bVar1) goto LAB_0078315c;
  }
  this_01 = *(Diagnostic **)((long)in_RSI + 0x20);
  sourceRange.endLoc = visitor;
  sourceRange.startLoc = in_RSI;
  ASTContext::addDiag((ASTContext *)this_00,unaff_retaddr_00,sourceRange);
  Diagnostic::operator<<(this_01,(string *)in_RDI);
LAB_0078315c:
  ConcatenationExpression::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
            ((ConcatenationExpression *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (SequenceMethodExprVisitor *)visitor);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (HasVisitExprs<T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }